

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::anon_unknown_1::AttachmentTextureLevelCase::test
          (AttachmentTextureLevelCase *this)

{
  CallLogWrapper *this_00;
  GLuint reference;
  GLuint textureID;
  GLuint framebufferID;
  
  framebufferID = 0;
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  glu::CallLogWrapper::glGenFramebuffers(this_00,1,&framebufferID);
  glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,framebufferID);
  ApiCase::expectError(&this->super_ApiCase,0);
  textureID = 0;
  glu::CallLogWrapper::glGenTextures(this_00,1,&textureID);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,textureID);
  glu::CallLogWrapper::glTexImage2D(this_00,0xde1,0,0x1907,0x40,0x40,0,0x1907,0x1401,(void *)0x0);
  ApiCase::expectError(&this->super_ApiCase,0);
  reference = textureID;
  glu::CallLogWrapper::glFramebufferTexture2D(this_00,0x8d40,0x8ce0,0xde1,textureID,0);
  ApiCase::expectError(&this->super_ApiCase,0);
  checkColorAttachmentParam
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
             0x8cd2,0,reference);
  glu::CallLogWrapper::glFramebufferTexture2D(this_00,0x8d40,0x8ce0,0xde1,0,0);
  glu::CallLogWrapper::glDeleteTextures(this_00,1,&textureID);
  glu::CallLogWrapper::glDeleteFramebuffers(this_00,1,&framebufferID);
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		GLuint framebufferID = 0;
		glGenFramebuffers(1, &framebufferID);
		glBindFramebuffer(GL_FRAMEBUFFER, framebufferID);
		expectError(GL_NO_ERROR);

		// GL_FRAMEBUFFER_ATTACHMENT_TEXTURE_LEVEL can only be 0
		{
			GLuint textureID = 0;

			glGenTextures(1, &textureID);
			glBindTexture(GL_TEXTURE_2D, textureID);
			glTexImage2D(GL_TEXTURE_2D, 0, GL_RGB, 64, 64, 0, GL_RGB, GL_UNSIGNED_BYTE, DE_NULL);
			expectError(GL_NO_ERROR);

			glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, textureID, 0);
			expectError(GL_NO_ERROR);

			checkColorAttachmentParam(m_testCtx, *this, GL_FRAMEBUFFER, GL_FRAMEBUFFER_ATTACHMENT_TEXTURE_LEVEL, 0);

			glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, 0, 0);
			glDeleteTextures(1, &textureID);
		}

		glDeleteFramebuffers(1, &framebufferID);
		expectError(GL_NO_ERROR);
	}